

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O3

string * __thiscall
cmFindPathCommand::FindNormalHeader_abi_cxx11_
          (string *__return_storage_ptr__,cmFindPathCommand *this)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer pbVar7;
  string tryPath;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  local_48 = 0;
  local_40 = '\0';
  pbVar6 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = &local_40;
  if (pbVar6 != pbVar4) {
    pbVar5 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      pbVar7 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar7 != pbVar5) {
        do {
          std::__cxx11::string::_M_assign((string *)&local_50);
          std::__cxx11::string::_M_append((char *)&local_50,(ulong)(pbVar6->_M_dataplus)._M_p);
          bVar3 = cmsys::SystemTools::FileExists(local_50);
          if (bVar3) {
            cVar1 = (this->super_cmFindBase).field_0x222;
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            if (cVar1 == '\x01') {
              if (local_50 == &local_40) {
                (__return_storage_ptr__->field_2)._M_allocated_capacity =
                     CONCAT71(uStack_3f,local_40);
                *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
              }
              else {
                (__return_storage_ptr__->_M_dataplus)._M_p = local_50;
                (__return_storage_ptr__->field_2)._M_allocated_capacity =
                     CONCAT71(uStack_3f,local_40);
              }
              __return_storage_ptr__->_M_string_length = local_48;
              local_48 = 0;
              local_40 = '\0';
              local_50 = &local_40;
            }
            else {
              pcVar2 = (pbVar7->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar7->_M_string_length);
            }
            goto LAB_002bb402;
          }
          pbVar5 = pbVar7 + 1;
          pbVar7 = pbVar5;
        } while (pbVar5 != (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        pbVar4 = (this->super_cmFindBase).Names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar4);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_002bb402:
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindNormalHeader()
{
  std::string tryPath;
  for (std::vector<std::string>::const_iterator ni = this->Names.begin();
       ni != this->Names.end(); ++ni) {
    for (std::vector<std::string>::const_iterator p =
           this->SearchPaths.begin();
         p != this->SearchPaths.end(); ++p) {
      tryPath = *p;
      tryPath += *ni;
      if (cmSystemTools::FileExists(tryPath.c_str())) {
        if (this->IncludeFileInPath) {
          return tryPath;
        }
        return *p;
      }
    }
  }
  return "";
}